

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O0

void __thiscall
kratos::FSM::FSM(FSM *this,string *name,Generator *generator,shared_ptr<kratos::Var> *clk,
                shared_ptr<kratos::Var> *reset)

{
  int local_34;
  shared_ptr<kratos::Var> *local_30;
  shared_ptr<kratos::Var> *reset_local;
  shared_ptr<kratos::Var> *clk_local;
  Generator *generator_local;
  string *name_local;
  FSM *this_local;
  
  local_30 = reset;
  reset_local = clk;
  clk_local = (shared_ptr<kratos::Var> *)generator;
  generator_local = (Generator *)name;
  name_local = &this->fsm_name_;
  std::__cxx11::string::string((string *)this,(string *)name);
  this->generator_ = (Generator *)clk_local;
  std::
  unordered_map<kratos::Var_*,_kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
  ::unordered_map(&this->outputs_);
  std::shared_ptr<kratos::Var>::shared_ptr(&this->clk_,clk);
  std::shared_ptr<kratos::Var>::shared_ptr(&this->reset_,reset);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FSMState>_>_>_>
  ::map(&this->states_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->state_names_);
  std::shared_ptr<kratos::FSMState>::shared_ptr(&this->start_state_,(nullptr_t)0x0);
  local_34 = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[1],_int,_true>(&this->start_state_debug_,(char (*) [1])0x41a899,&local_34);
  this->current_state_ = (EnumVar *)0x0;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  ::unordered_map(&this->fn_name_ln_);
  this->realized_ = false;
  this->moore_ = true;
  this->reset_high_ = true;
  this->parent_fsm_ = (FSM *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
  ::map(&this->child_fsms_);
  return;
}

Assistant:

FSM::FSM(std::string name, kratos::Generator* generator, std::shared_ptr<Var> clk,
         std::shared_ptr<Var> reset)
    : fsm_name_(std::move(name)),
      generator_(generator),
      clk_(std::move(clk)),
      reset_(std::move(reset)) {}